

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O0

void WebRtcSpl_LPBy2ShortToInt(int16_t *in,int32_t len,int32_t *out,int32_t *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_38;
  int local_34;
  int32_t i;
  int32_t diff;
  int32_t tmp1;
  int32_t tmp0;
  int32_t *state_local;
  int32_t *out_local;
  int32_t len_local;
  int16_t *in_local;
  
  iVar1 = len >> 1;
  diff = state[0xc];
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    iVar2 = *state + ((diff - state[1]) + 0x2000 >> 0xe) * 0xbea;
    *state = diff;
    local_34 = iVar2 - state[2] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar3 = state[1] + local_34 * 0x2498;
    state[1] = iVar2;
    local_34 = iVar3 - state[3] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[3] = state[2] + local_34 * 0x3ad7;
    state[2] = iVar3;
    out[local_38 << 1] = state[3] >> 1;
    diff = in[(long)(local_38 << 1) + 1] * 0x8000 + 0x4000;
  }
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    iVar2 = in[local_38 << 1] * 0x8000 + 0x4000;
    iVar3 = state[4] + ((iVar2 - state[5]) + 0x2000 >> 0xe) * 0x335;
    state[4] = iVar2;
    local_34 = iVar3 - state[6] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar2 = state[5] + local_34 * 0x17de;
    state[5] = iVar3;
    local_34 = iVar2 - state[7] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[7] = state[6] + local_34 * 0x305e;
    state[6] = iVar2;
    out[local_38 << 1] = out[local_38 << 1] + (state[7] >> 1) >> 0xf;
  }
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    iVar2 = in[local_38 << 1] * 0x8000 + 0x4000;
    iVar3 = state[8] + ((iVar2 - state[9]) + 0x2000 >> 0xe) * 0xbea;
    state[8] = iVar2;
    local_34 = iVar3 - state[10] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar2 = state[9] + local_34 * 0x2498;
    state[9] = iVar3;
    local_34 = iVar2 - state[0xb] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[0xb] = state[10] + local_34 * 0x3ad7;
    state[10] = iVar2;
    out[(long)(local_38 << 1) + 1] = state[0xb] >> 1;
  }
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    iVar2 = in[(long)(local_38 << 1) + 1] * 0x8000 + 0x4000;
    iVar3 = state[0xc] + ((iVar2 - state[0xd]) + 0x2000 >> 0xe) * 0x335;
    state[0xc] = iVar2;
    local_34 = iVar3 - state[0xe] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar2 = state[0xd] + local_34 * 0x17de;
    state[0xd] = iVar3;
    local_34 = iVar2 - state[0xf] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[0xf] = state[0xe] + local_34 * 0x305e;
    state[0xe] = iVar2;
    out[(long)(local_38 << 1) + 1] = out[(long)(local_38 << 1) + 1] + (state[0xf] >> 1) >> 0xf;
  }
  return;
}

Assistant:

void WebRtcSpl_LPBy2ShortToInt(const int16_t* in, int32_t len, int32_t* out,
                               int32_t* state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    len >>= 1;

    // lower allpass filter: odd input -> even output samples
    in++;
    // initial state of polyphase delay element
    tmp0 = state[12];
    for (i = 0; i < len; i++)
    {
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, round and store
        out[i << 1] = state[3] >> 1;
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
    }
    in--;

    // upper allpass filter: even input -> even output samples
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // average the two allpass outputs, scale down and store
        out[i << 1] = (out[i << 1] + (state[7] >> 1)) >> 15;
    }

    // switch to odd output samples
    out++;

    // lower allpass filter: even input -> odd output samples
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[9];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[8] + diff * kResampleAllpass[1][0];
        state[8] = tmp0;
        diff = tmp1 - state[10];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[9] + diff * kResampleAllpass[1][1];
        state[9] = tmp1;
        diff = tmp0 - state[11];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[11] = state[10] + diff * kResampleAllpass[1][2];
        state[10] = tmp0;

        // scale down, round and store
        out[i << 1] = state[11] >> 1;
    }

    // upper allpass filter: odd input -> odd output samples
    in++;
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[13];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[12] + diff * kResampleAllpass[0][0];
        state[12] = tmp0;
        diff = tmp1 - state[14];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[13] + diff * kResampleAllpass[0][1];
        state[13] = tmp1;
        diff = tmp0 - state[15];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[15] = state[14] + diff * kResampleAllpass[0][2];
        state[14] = tmp0;

        // average the two allpass outputs, scale down and store
        out[i << 1] = (out[i << 1] + (state[15] >> 1)) >> 15;
    }
}